

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarBmcInter(Abc_Ntk_t *pNtk,Inter_ManParams_t *pPars,Abc_Ntk_t **ppNtkRes)

{
  long lVar1;
  Abc_Ntk_t *pAVar2;
  Aig_Man_t *local_40;
  Aig_Man_t *pManNew;
  Aig_Man_t *pAStack_30;
  int RetValue;
  Aig_Man_t *pMan;
  Abc_Ntk_t **ppNtkRes_local;
  Inter_ManParams_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  if (ppNtkRes != (Abc_Ntk_t **)0x0) {
    *ppNtkRes = (Abc_Ntk_t *)0x0;
  }
  pMan = (Aig_Man_t *)ppNtkRes;
  ppNtkRes_local = (Abc_Ntk_t **)pPars;
  pPars_local = (Inter_ManParams_t *)pNtk;
  pAStack_30 = Abc_NtkToDar(pNtk,0,1);
  if (pAStack_30 == (Aig_Man_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    pNtk_local._4_4_ = -1;
  }
  else {
    if ((*(int *)(ppNtkRes_local + 6) == 0) || (pMan == (Aig_Man_t *)0x0)) {
      pManNew._4_4_ =
           Abc_NtkDarBmcInter_int(pAStack_30,(Inter_ManParams_t *)ppNtkRes_local,(Aig_Man_t **)0x0);
    }
    else {
      pManNew._4_4_ =
           Abc_NtkDarBmcInter_int(pAStack_30,(Inter_ManParams_t *)ppNtkRes_local,&local_40);
      pAVar2 = Abc_NtkFromAigPhase(local_40);
      pMan->pName = (char *)pAVar2;
      Aig_ManStop(local_40);
    }
    lVar1._0_4_ = pPars_local[3].fVerbose;
    lVar1._4_4_ = pPars_local[3].iFrameMax;
    if (lVar1 != 0) {
      free(*(void **)&pPars_local[3].fVerbose);
      pPars_local[3].fVerbose = 0;
      pPars_local[3].iFrameMax = 0;
    }
    if (pPars_local[3].pFileName != (char *)0x0) {
      free(pPars_local[3].pFileName);
      pPars_local[3].pFileName = (char *)0x0;
    }
    pPars_local[3].pFileName = (char *)pAStack_30->pSeqModel;
    pAStack_30->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pAStack_30);
    pNtk_local._4_4_ = pManNew._4_4_;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarBmcInter( Abc_Ntk_t * pNtk, Inter_ManParams_t * pPars, Abc_Ntk_t ** ppNtkRes )
{
    Aig_Man_t * pMan;
    int RetValue;
    if ( ppNtkRes )
        *ppNtkRes = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    if ( pPars->fUseSeparate && ppNtkRes )
    {
        Aig_Man_t * pManNew;
        RetValue = Abc_NtkDarBmcInter_int( pMan, pPars, &pManNew );
        *ppNtkRes = Abc_NtkFromAigPhase( pManNew );
        Aig_ManStop( pManNew );
    }
    else
    {
        RetValue = Abc_NtkDarBmcInter_int( pMan, pPars, NULL );
    }
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}